

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

void deqp::RobustBufferAccessBehavior::Texture::Storage
               (Functions *gl,GLenum target,GLsizei levels,GLenum internal_format,GLuint width,
               GLuint height,GLuint depth)

{
  GLenum err;
  TestError *this;
  int line;
  char *msg;
  
  if ((int)target < 0x8513) {
    if ((int)target < 0x806f) {
      if (target == 0xde0) {
        (*gl->texStorage1D)(0xde0,levels,internal_format,width);
        err = (*gl->getError)();
        msg = "TexStorage1D";
        line = 0x35a;
        goto LAB_00d90597;
      }
      if (target != 0xde1) goto LAB_00d905a3;
    }
    else {
      if (target == 0x806f) goto LAB_00d90538;
      if (target != 0x84f5) goto LAB_00d905a3;
    }
  }
  else {
    if (0x8c19 < (int)target) {
      if (target != 0x8c1a) {
        if (target == 0x9100) {
          (*gl->texStorage2DMultisample)(0x9100,levels,internal_format,width,height,'\0');
          err = (*gl->getError)();
          msg = "TexStorage2DMultisample";
          line = 0x365;
          goto LAB_00d90597;
        }
        goto LAB_00d905a3;
      }
LAB_00d90538:
      (*gl->texStorage3D)(target,levels,internal_format,width,height,depth);
      err = (*gl->getError)();
      msg = "TexStorage3D";
      line = 0x36a;
      goto LAB_00d90597;
    }
    if ((target != 0x8513) && (target != 0x8c18)) {
LAB_00d905a3:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invliad enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                 ,0x36d);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  (*gl->texStorage2D)(target,levels,internal_format,width,height);
  err = (*gl->getError)();
  msg = "TexStorage2D";
  line = 0x361;
LAB_00d90597:
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,line);
  return;
}

Assistant:

void Texture::Storage(const glw::Functions& gl, glw::GLenum target, glw::GLsizei levels, glw::GLenum internal_format,
					  glw::GLuint width, glw::GLuint height, glw::GLuint depth)
{
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.texStorage1D(target, levels, internal_format, width);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage1D");
		break;
	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
	case GL_TEXTURE_CUBE_MAP:
		gl.texStorage2D(target, levels, internal_format, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
		break;
	case GL_TEXTURE_2D_MULTISAMPLE:
		gl.texStorage2DMultisample(target, levels, internal_format, width, height, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2DMultisample");
		break;
	case GL_TEXTURE_3D:
	case GL_TEXTURE_2D_ARRAY:
		gl.texStorage3D(target, levels, internal_format, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage3D");
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}
}